

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jstdhuff.c
# Opt level: O2

void add_huff_table(j_common_ptr cinfo,JHUFF_TBL **htblptr,UINT8 *bits,UINT8 *val)

{
  jpeg_error_mgr *pjVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  JHUFF_TBL *pJVar5;
  long lVar6;
  uint uVar7;
  
  if (*htblptr != (JHUFF_TBL *)0x0) {
    return;
  }
  pJVar5 = jpeg_alloc_huff_table(cinfo);
  *htblptr = pJVar5;
  uVar2 = *(undefined4 *)(bits + 4);
  uVar3 = *(undefined4 *)(bits + 8);
  uVar4 = *(undefined4 *)(bits + 0xc);
  *(undefined4 *)pJVar5->bits = *(undefined4 *)bits;
  *(undefined4 *)(pJVar5->bits + 4) = uVar2;
  *(undefined4 *)(pJVar5->bits + 8) = uVar3;
  *(undefined4 *)(pJVar5->bits + 0xc) = uVar4;
  pJVar5->bits[0x10] = bits[0x10];
  uVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    uVar7 = uVar7 + bits[lVar6 + 1];
  }
  if (uVar7 - 0x101 < 0xffffff00) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 8;
    (*pjVar1->error_exit)(cinfo);
  }
  memcpy((*htblptr)->huffval,val,(ulong)uVar7);
  memset((*htblptr)->huffval + uVar7,0,(long)(int)(0x100 - uVar7));
  (*htblptr)->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
add_huff_table(j_common_ptr cinfo, JHUFF_TBL **htblptr, const UINT8 *bits,
               const UINT8 *val)
/* Define a Huffman table */
{
  int nsymbols, len;

  if (*htblptr == NULL)
    *htblptr = jpeg_alloc_huff_table(cinfo);
  else
    return;

  /* Copy the number-of-symbols-of-each-code-length counts */
  MEMCOPY((*htblptr)->bits, bits, sizeof((*htblptr)->bits));

  /* Validate the counts.  We do this here mainly so we can copy the right
   * number of symbols from the val[] array, without risking marching off
   * the end of memory.  jchuff.c will do a more thorough test later.
   */
  nsymbols = 0;
  for (len = 1; len <= 16; len++)
    nsymbols += bits[len];
  if (nsymbols < 1 || nsymbols > 256)
    ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

  MEMCOPY((*htblptr)->huffval, val, nsymbols * sizeof(UINT8));
  MEMZERO(&((*htblptr)->huffval[nsymbols]), (256 - nsymbols) * sizeof(UINT8));

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*htblptr)->sent_table = FALSE;
}